

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Node::AddList(Node *this,string *name,string *value)

{
  element_type *this_00;
  shared_ptr<Node> local_a0;
  string local_90 [55];
  allocator local_59;
  string local_58 [39];
  undefined1 local_31;
  undefined1 local_30 [8];
  shared_ptr<Node> list_node;
  string *value_local;
  string *name_local;
  Node *this_local;
  
  local_31 = 1;
  list_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value;
  std::make_shared<Node,std::__cxx11::string&,bool>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (bool *)name);
  this_00 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"List",&local_59);
  std::__cxx11::string::string(local_90,(string *)value);
  AddAttribute(this_00,(string *)local_58,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::shared_ptr<Node>::shared_ptr(&local_a0,(shared_ptr<Node> *)local_30);
  AddChild(this,&local_a0);
  std::shared_ptr<Node>::~shared_ptr(&local_a0);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_30);
  return;
}

Assistant:

void Node::AddList(std::string name, std::string value) {
    std::shared_ptr<Node> list_node = std::make_shared<Node>(name, true);
    list_node->AddAttribute("List", value);
    this->AddChild(list_node);
}